

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  logic_t *value;
  ostream *poVar3;
  ostringstream os;
  allocator local_291;
  string local_290;
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210;
  string local_1f0 [32];
  undefined1 local_1d0 [40];
  ostringstream local_1a8 [376];
  
  value = *(logic_t **)this;
  iVar1 = rhs->value;
  iVar2 = value->value;
  std::__cxx11::string::string(local_1f0,"==",&local_291);
  std::__cxx11::string::string(local_270,local_1f0);
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::logic_t>(&local_290,value);
  poVar3 = std::operator<<((ostream *)local_1a8,(string *)&local_290);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,local_270);
  poVar3 = std::operator<<(poVar3," ");
  to_string<(anonymous_namespace)::logic_t>(&local_210,rhs);
  std::operator<<(poVar3,(string *)&local_210);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string(local_250,(string *)&local_290);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::__cxx11::string::string(local_230,local_250);
  local_1d0[0] = iVar2 == iVar1;
  std::__cxx11::string::string((string *)(local_1d0 + 8),local_230);
  result::result(__return_storage_ptr__,(result *)local_1d0);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }